

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper::RunImpl
          (initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper *this)

{
  Message *pMVar1;
  TestResults *this_00;
  bool bVar2;
  Header *pHVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_618;
  UtcTimeStamp local_5f8;
  Logon local_5e0;
  undefined1 local_488 [8];
  Message receivedLogon;
  Logon local_320;
  Message local_1c8 [8];
  Message sentLogon;
  UtcTimeOnly local_70;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper *local_10;
  initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_70,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,
             &local_70);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_70);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  createLogon(&local_320,"TW","ISLD",1);
  FIX::Message::Message(local_1c8,(Message *)&local_320);
  FIX42::Logon::~Logon(&local_320);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_5e0,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_488,(Message *)&local_5e0);
  FIX42::Logon::~Logon(&local_5e0);
  pHVar3 = FIX::Message::getHeader((Message *)local_488);
  FIX::FieldMap::removeField((int)pHVar3);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_5f8);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_488,SUB81(&local_5f8,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_5f8);
  bVar2 = FIX::Session::isLoggedOn((this->super_initiatorFixture).super_sessionFixture.object);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_618,*ppTVar5,0x9ae);
    UnitTest::TestResults::OnTestFailure(this_00,&local_618,"!object->isLoggedOn()");
  }
  FIX::Message::~Message((Message *)local_488);
  FIX::Message::~Message(local_1c8);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LoginTargetCompID_RequiredFieldMissing_NoLogon)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  receivedLogon.getHeader().removeField(FIELD::TargetCompID);
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(!object->isLoggedOn());
}